

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

vec2 djb::ggx::md2_to_u2(vec2 *d,float_t zi)

{
  float_t fVar1;
  float_t fVar2;
  float_t fVar3;
  double dVar4;
  float_t y_1;
  float_t tmp_1;
  float_t x_1;
  float_t y;
  float_t tmp2;
  float_t phi;
  float_t x;
  vec2 tmp;
  float_t a;
  float_t zi_local;
  vec2 *d_local;
  
  tmp.x = 1.0 / (zi + 1.0);
  tmp.y = zi;
  if (d->x < 0.0) {
    fVar1 = dot(d,d);
    dVar4 = std::atan2((double)(ulong)(uint)-d->x,(double)(ulong)(uint)d->y);
    fVar2 = m_pi();
    vec2::vec2((vec2 *)&d_local,fVar1,(SUB84(dVar4,0) / fVar2) * tmp.x);
  }
  else {
    vec2::vec2((vec2 *)&phi,d->x / zi,d->y);
    fVar1 = dot((vec2 *)&phi,(vec2 *)&phi);
    dVar4 = std::atan2((double)(ulong)(uint)-phi,(double)(ulong)(uint)x);
    for (y = SUB84(dVar4,0); y < 0.0; y = fVar2 + fVar2 + y) {
      fVar2 = m_pi();
    }
    fVar2 = m_pi();
    fVar3 = m_pi();
    vec2::vec2((vec2 *)&d_local,fVar1,((y - fVar2) / fVar3) * (1.0 - tmp.x) + tmp.x);
  }
  return (vec2)d_local;
}

Assistant:

vec2 ggx::md2_to_u2(const vec2& d, float_t zi)
{
	float_t a = 1 / (1 + zi);

#if 0
	if (d.x >= 0) {
		vec2 tmp = hd2_to_u2(vec2(d.x / zi, d.y));

		return vec2(tmp.x * (1 - a) + a, tmp.y);
	} else {
		vec2 tmp = hd2_to_u2(d);

		return vec2(a + a * tmp.x, tmp.y);
	}
#else

	if (d.x >= 0) {
		vec2 tmp = vec2(d.x / zi, d.y);
		float_t x = dot(tmp, tmp);
		float_t phi = atan2(-tmp.x, tmp.y);
		while (phi < 0) phi+= 2*m_pi();
		float_t tmp2 = (phi - m_pi()) / m_pi();
		float_t y = tmp2 * (1 - a) + a;

		return vec2(x, y);
	} else {
		float_t x = dot(d, d);
		float_t tmp = atan2(-d.x, d.y) / m_pi();
		float_t y = tmp * a;

		return vec2(x, y);
	}
#endif
}